

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

bool __thiscall QVariant::toBool(QVariant *this)

{
  long lVar1;
  bool bVar2;
  QMetaType from;
  bool *pbVar3;
  long in_FS_OFFSET;
  bool res;
  QMetaType boolType;
  QMetaType in_stack_00000070;
  QMetaType in_stack_00000078;
  QMetaType *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  from = QMetaType::fromType<bool>();
  Private::type((Private *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  bVar2 = ::operator==((QMetaType *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
  if (bVar2) {
    pbVar3 = Private::get<bool>((Private *)0x437c29);
    bVar2 = (bool)(*pbVar3 & 1);
  }
  else {
    Private::type((Private *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    constData((QVariant *)0x437c51);
    QMetaType::convert(in_stack_00000078,from.d_ptr,in_stack_00000070,
                       (void *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QVariant::toBool() const
{
    auto boolType = QMetaType::fromType<bool>();
    if (d.type() == boolType)
        return d.get<bool>();

    bool res = false;
    QMetaType::convert(d.type(), constData(), boolType, &res);
    return res;
}